

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmuxgenerator.cpp
# Opt level: O0

string * __thiscall
PortMuxGenerator::generateCode_abi_cxx11_(string *__return_storage_ptr__,PortMuxGenerator *this)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int *extraout_RDX;
  int *arg;
  int *extraout_RDX_00;
  int *arg_00;
  int *extraout_RDX_01;
  int *piVar4;
  int *arg_01;
  int *arg_02;
  int *arg_03;
  int *arg_04;
  int *extraout_RDX_02;
  int *extraout_RDX_03;
  int *arg_05;
  int *arg_06;
  int *arg_07;
  int *arg_08;
  int *extraout_RDX_04;
  int *extraout_RDX_05;
  int *arg_09;
  int *extraout_RDX_06;
  int *extraout_RDX_07;
  int *extraout_RDX_08;
  int *arg_10;
  int *extraout_RDX_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e78;
  undefined1 local_e58 [8];
  string indexString_3;
  string partialCode_2;
  undefined1 local_e10 [4];
  int i_3;
  string muxIndexString_4;
  undefined1 local_de8 [4];
  int j_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  undefined1 local_da8 [8];
  string muxIndexString_3;
  undefined1 local_d80 [4];
  int j_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  undefined1 local_c80 [8];
  string indexString_2;
  string partialCode_1;
  undefined1 local_c38 [4];
  int i_2;
  string muxIndexString_2;
  undefined1 local_c10 [4];
  int j_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  int local_bac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  string local_b08;
  int local_ae4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  int local_97c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  undefined1 local_8d8 [8];
  string indexString_1;
  undefined1 local_8b0 [4];
  int i_1;
  string muxIndexString_1;
  int j_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  int local_824;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  int local_75c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  int local_694;
  undefined1 local_690 [4];
  int j_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  string local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  string local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string indexString;
  string partialCode;
  int i;
  undefined1 local_40 [8];
  string muxIndexString;
  int j;
  PortMuxGenerator *this_local;
  string *code;
  
  muxIndexString.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  piVar4 = extraout_RDX;
  for (muxIndexString.field_2._8_4_ = 1; (int)muxIndexString.field_2._8_4_ <= this->numMuxes_;
      muxIndexString.field_2._8_4_ = muxIndexString.field_2._8_4_ + 1) {
    boost::lexical_cast<std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (boost *)(muxIndexString.field_2._M_local_buf + 8),piVar4);
    for (partialCode.field_2._8_4_ = 1; uVar1 = partialCode.field_2._8_4_,
        iVar3 = getMuxNumPorts(this,muxIndexString.field_2._8_4_ + -1), (int)uVar1 <= iVar3;
        partialCode.field_2._8_4_ = partialCode.field_2._8_4_ + 1) {
      std::__cxx11::string::string((string *)(indexString.field_2._M_local_buf + 8));
      boost::lexical_cast<std::__cxx11::string,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 (boost *)(partialCode.field_2._M_local_buf + 8),arg);
      std::operator+(&local_110,"  BufferedPort<Bottle> receiverBuff",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::operator+(&local_f0,&local_110,"Mux");
      std::operator+(&local_d0,&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_b0,&local_d0,";\n");
      std::__cxx11::string::operator=
                ((string *)(indexString.field_2._M_local_buf + 8),(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      bVar2 = getFromRos(this);
      if (bVar2) {
        std::operator+(&local_190,"  receiverBuff",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::operator+(&local_170,&local_190,"Mux");
        std::operator+(&local_150,&local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_130,&local_150,".setReadOnly();\n");
        std::__cxx11::string::operator+=
                  ((string *)(indexString.field_2._M_local_buf + 8),(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,(string *)(indexString.field_2._M_local_buf + 8)
                  );
        std::operator+(&local_350,"  bool receiver",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::operator+(&local_330,&local_350,"Mux");
        std::operator+(&local_310,&local_330,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_2f0,&local_310,"Ok = receiverBuff");
        std::operator+(&local_2d0,&local_2f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::operator+(&local_2b0,&local_2d0,"Mux");
        std::operator+(&local_290,&local_2b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_270,&local_290,".open(\"");
        extractPortFromString_abi_cxx11_
                  (&local_370,this,muxIndexString.field_2._8_4_ + -1,partialCode.field_2._8_4_);
        std::operator+(&local_250,&local_270,&local_370);
        std::operator+(&local_230,&local_250,"@/mux");
        std::operator+(&local_210,&local_230,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_1f0,&local_210,"/receiver");
        std::operator+(&local_1d0,&local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::operator+(&local_1b0,&local_1d0,"\");\n");
        std::__cxx11::string::operator=
                  ((string *)(indexString.field_2._M_local_buf + 8),(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&local_350);
      }
      else {
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,(string *)(indexString.field_2._M_local_buf + 8)
                  );
        std::operator+(&local_530,"  bool receiver",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::operator+(&local_510,&local_530,"Mux");
        std::operator+(&local_4f0,&local_510,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_4d0,&local_4f0,"Ok = receiverBuff");
        std::operator+(&local_4b0,&local_4d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::operator+(&local_490,&local_4b0,"Mux");
        std::operator+(&local_470,&local_490,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_450,&local_470,".open(\"/");
        std::operator+(&local_430,&local_450,&this->output_port_name);
        std::operator+(&local_410,&local_430,"/mux");
        std::operator+(&local_3f0,&local_410,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_3d0,&local_3f0,"/receiver");
        std::operator+(&local_3b0,&local_3d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::operator+(&local_390,&local_3b0,"\");\n");
        std::__cxx11::string::operator=
                  ((string *)(indexString.field_2._M_local_buf + 8),(string *)&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&local_530);
      }
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)(indexString.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)(indexString.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    std::__cxx11::string::~string((string *)local_40);
    piVar4 = extraout_RDX_00;
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  Port outputPort;\n");
  if ((this->toRos_ & 1U) != 0) {
    getRosMessageName_abi_cxx11_(&local_590,this);
    std::operator+(&local_570,"  outputPort.promiseType(Type::byNameOnWire(\"",&local_590);
    std::operator+(&local_550,&local_570,"\"));\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_550);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_590);
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"  outputPort.setWriteOnly();\n");
  if ((this->toRos_ & 1U) == 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "  bool outputOk = outputPort.open(\"/writeBuff \");\n\n");
  }
  else {
    getOutputName_abi_cxx11_(&local_630,this);
    std::operator+(&local_610,"  bool outputOk = outputPort.open(\"",&local_630);
    std::operator+(&local_5f0,&local_610,"@/yarp/");
    std::operator+(&local_5d0,&local_5f0,&this->output_port_name);
    std::operator+(&local_5b0,&local_5d0,"\");\n\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_630);
  }
  if ((this->fromRos_ & 1U) == 0) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"  bool allConnected = false;\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "  std::vector<std::vector<bool> > portsConnected;\n");
    boost::lexical_cast<std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690,
               (boost *)&this->numMuxes_,arg_00);
    std::operator+(&local_670,"  portsConnected.resize(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690);
    std::operator+(&local_650,&local_670,");\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_650);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)local_690);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  int totalConnections=0;\n")
    ;
    piVar4 = extraout_RDX_01;
    for (local_694 = 0; local_694 < this->numMuxes_; local_694 = local_694 + 1) {
      boost::lexical_cast<std::__cxx11::string,int>(&local_738,(boost *)&local_694,piVar4);
      std::operator+(&local_718,"    portsConnected[",&local_738);
      std::operator+(&local_6f8,&local_718,"].resize(");
      local_75c = getMuxNumPorts(this,local_694);
      boost::lexical_cast<std::__cxx11::string,int>(&local_758,(boost *)&local_75c,arg_01);
      std::operator+(&local_6d8,&local_6f8,&local_758);
      std::operator+(&local_6b8,&local_6d8,");\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_718);
      std::__cxx11::string::~string((string *)&local_738);
      boost::lexical_cast<std::__cxx11::string,int>(&local_800,(boost *)&local_694,arg_02);
      std::operator+(&local_7e0,"    portsConnected[",&local_800);
      std::operator+(&local_7c0,&local_7e0,"].assign(");
      local_824 = getMuxNumPorts(this,local_694);
      boost::lexical_cast<std::__cxx11::string,int>(&local_820,(boost *)&local_824,arg_03);
      std::operator+(&local_7a0,&local_7c0,&local_820);
      std::operator+(&local_780,&local_7a0,",false);\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_780);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_820);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::__cxx11::string::~string((string *)&local_800);
      muxIndexString_1.field_2._12_4_ = getMuxNumPorts(this,local_694);
      boost::lexical_cast<std::__cxx11::string,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j_2,
                 (boost *)(muxIndexString_1.field_2._M_local_buf + 0xc),arg_04);
      std::operator+(&local_868,"    totalConnections += ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j_2);
      std::operator+(&local_848,&local_868,";\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_848);
      std::__cxx11::string::~string((string *)&local_848);
      std::__cxx11::string::~string((string *)&local_868);
      std::__cxx11::string::~string((string *)&j_2);
      piVar4 = extraout_RDX_02;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  while (!allConnected){\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"    int connectedNumber=totalConnections;\n");
    piVar4 = extraout_RDX_03;
    for (muxIndexString_1.field_2._8_4_ = 1; (int)muxIndexString_1.field_2._8_4_ <= this->numMuxes_;
        muxIndexString_1.field_2._8_4_ = muxIndexString_1.field_2._8_4_ + 1) {
      boost::lexical_cast<std::__cxx11::string,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8b0,
                 (boost *)(muxIndexString_1.field_2._M_local_buf + 8),piVar4);
      for (indexString_1.field_2._12_4_ = 1; uVar1 = indexString_1.field_2._12_4_,
          iVar3 = getMuxNumPorts(this,muxIndexString_1.field_2._8_4_ + -1), (int)uVar1 <= iVar3;
          indexString_1.field_2._12_4_ = indexString_1.field_2._12_4_ + 1) {
        boost::lexical_cast<std::__cxx11::string,int>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d8,
                   (boost *)(indexString_1.field_2._M_local_buf + 0xc),arg_05);
        local_97c = muxIndexString_1.field_2._8_4_ + -1;
        boost::lexical_cast<std::__cxx11::string,int>(&local_978,(boost *)&local_97c,arg_06);
        std::operator+(&local_958,"    if (!portsConnected[",&local_978);
        std::operator+(&local_938,&local_958,"][");
        std::operator+(&local_918,&local_938,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8d8);
        std::operator+(&local_8f8,&local_918,"]){\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_8f8);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::__cxx11::string::~string((string *)&local_918);
        std::__cxx11::string::~string((string *)&local_938);
        std::__cxx11::string::~string((string *)&local_958);
        std::__cxx11::string::~string((string *)&local_978);
        local_ae4 = muxIndexString_1.field_2._8_4_ + -1;
        boost::lexical_cast<std::__cxx11::string,int>(&local_ae0,(boost *)&local_ae4,arg_07);
        std::operator+(&local_ac0,"      portsConnected[",&local_ae0);
        std::operator+(&local_aa0,&local_ac0,"][");
        std::operator+(&local_a80,&local_aa0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8d8);
        std::operator+(&local_a60,&local_a80,"] = yarp.connect(\"");
        extractPortFromString_abi_cxx11_
                  (&local_b08,this,muxIndexString_1.field_2._8_4_ + -1,indexString_1.field_2._12_4_)
        ;
        std::operator+(&local_a40,&local_a60,&local_b08);
        std::operator+(&local_a20,&local_a40,"\", receiverBuff");
        std::operator+(&local_a00,&local_a20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8d8);
        std::operator+(&local_9e0,&local_a00,"Mux");
        std::operator+(&local_9c0,&local_9e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8b0);
        std::operator+(&local_9a0,&local_9c0,".getName());\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_9a0);
        std::__cxx11::string::~string((string *)&local_9a0);
        std::__cxx11::string::~string((string *)&local_9c0);
        std::__cxx11::string::~string((string *)&local_9e0);
        std::__cxx11::string::~string((string *)&local_a00);
        std::__cxx11::string::~string((string *)&local_a20);
        std::__cxx11::string::~string((string *)&local_a40);
        std::__cxx11::string::~string((string *)&local_b08);
        std::__cxx11::string::~string((string *)&local_a60);
        std::__cxx11::string::~string((string *)&local_a80);
        std::__cxx11::string::~string((string *)&local_aa0);
        std::__cxx11::string::~string((string *)&local_ac0);
        std::__cxx11::string::~string((string *)&local_ae0);
        local_bac = muxIndexString_1.field_2._8_4_ + -1;
        boost::lexical_cast<std::__cxx11::string,int>(&local_ba8,(boost *)&local_bac,arg_08);
        std::operator+(&local_b88,"      if (!portsConnected[",&local_ba8);
        std::operator+(&local_b68,&local_b88,"][");
        std::operator+(&local_b48,&local_b68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8d8);
        std::operator+(&local_b28,&local_b48,"])\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b28);
        std::__cxx11::string::~string((string *)&local_b28);
        std::__cxx11::string::~string((string *)&local_b48);
        std::__cxx11::string::~string((string *)&local_b68);
        std::__cxx11::string::~string((string *)&local_b88);
        std::__cxx11::string::~string((string *)&local_ba8);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"        connectedNumber--;\n");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    }");
        std::__cxx11::string::~string((string *)local_8d8);
      }
      std::__cxx11::string::~string((string *)local_8b0);
      piVar4 = extraout_RDX_04;
    }
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"    if (connectedNumber == totalConnections)\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"      allConnected = true;\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"    std::cout << \".\\n\";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    Time::delay(1);\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  }");
  }
  bVar2 = getFromRos(this);
  if (bVar2) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "  std::cout << \"Waiting for output...\" << std::endl;\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"  bool connectSuccess = false;\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"  while(!connectSuccess) {\n");
    getOutputName_abi_cxx11_((string *)local_c10,this);
    std::operator+(&local_bf0,"    connectSuccess = yarp.connect(\" /writeBuff\", \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c10);
    std::operator+(&local_bd0,&local_bf0,"\");\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_bd0);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::__cxx11::string::~string((string *)&local_bf0);
    std::__cxx11::string::~string((string *)local_c10);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    Time::delay(1);\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"    std::cout << \".\\n\";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  }\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "  std::cout << \"Connection successfuly established.\" << std::endl;\n\n");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  int counter = 0;\n\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  while(true){\n");
  piVar4 = extraout_RDX_05;
  for (muxIndexString_2.field_2._12_4_ = 1; (int)muxIndexString_2.field_2._12_4_ <= this->numMuxes_;
      muxIndexString_2.field_2._12_4_ = muxIndexString_2.field_2._12_4_ + 1) {
    boost::lexical_cast<std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c38,
               (boost *)(muxIndexString_2.field_2._M_local_buf + 0xc),piVar4);
    for (partialCode_1.field_2._12_4_ = 1; uVar1 = partialCode_1.field_2._12_4_,
        iVar3 = getMuxNumPorts(this,muxIndexString_2.field_2._12_4_ + -1), (int)uVar1 <= iVar3;
        partialCode_1.field_2._12_4_ = partialCode_1.field_2._12_4_ + 1) {
      std::__cxx11::string::string((string *)(indexString_2.field_2._M_local_buf + 8));
      boost::lexical_cast<std::__cxx11::string,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c80,
                 (boost *)(partialCode_1.field_2._M_local_buf + 0xc),arg_09);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d80,
                     "    Bottle* reading",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c80)
      ;
      std::operator+(&local_d60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d80,
                     "Mux");
      std::operator+(&local_d40,&local_d60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c38)
      ;
      std::operator+(&local_d20,&local_d40," = receiverBuff");
      std::operator+(&local_d00,&local_d20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c80)
      ;
      std::operator+(&local_ce0,&local_d00,"Mux");
      std::operator+(&local_cc0,&local_ce0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c38)
      ;
      std::operator+(&local_ca0,&local_cc0,".read();\n");
      std::__cxx11::string::operator=
                ((string *)(indexString_2.field_2._M_local_buf + 8),(string *)&local_ca0);
      std::__cxx11::string::~string((string *)&local_ca0);
      std::__cxx11::string::~string((string *)&local_cc0);
      std::__cxx11::string::~string((string *)&local_ce0);
      std::__cxx11::string::~string((string *)&local_d00);
      std::__cxx11::string::~string((string *)&local_d20);
      std::__cxx11::string::~string((string *)&local_d40);
      std::__cxx11::string::~string((string *)&local_d60);
      std::__cxx11::string::~string((string *)local_d80);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)(indexString_2.field_2._M_local_buf + 8)
                );
      std::__cxx11::string::~string((string *)local_c80);
      std::__cxx11::string::~string((string *)(indexString_2.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    std::__cxx11::string::~string((string *)local_c38);
    piVar4 = extraout_RDX_06;
  }
  for (muxIndexString_3.field_2._12_4_ = 1; (int)muxIndexString_3.field_2._12_4_ <= this->numMuxes_;
      muxIndexString_3.field_2._12_4_ = muxIndexString_3.field_2._12_4_ + 1) {
    boost::lexical_cast<std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_da8,
               (boost *)(muxIndexString_3.field_2._M_local_buf + 0xc),piVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_de8,
                   "    Bottle mux",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_da8);
    std::operator+(&local_dc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_de8,
                   ";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_dc8);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::__cxx11::string::~string((string *)local_de8);
    std::__cxx11::string::~string((string *)local_da8);
    piVar4 = extraout_RDX_07;
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  piVar4 = extraout_RDX_08;
  for (muxIndexString_4.field_2._12_4_ = 1; (int)muxIndexString_4.field_2._12_4_ <= this->numMuxes_;
      muxIndexString_4.field_2._12_4_ = muxIndexString_4.field_2._12_4_ + 1) {
    boost::lexical_cast<std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e10,
               (boost *)(muxIndexString_4.field_2._M_local_buf + 0xc),piVar4);
    for (partialCode_2.field_2._12_4_ = 1; uVar1 = partialCode_2.field_2._12_4_,
        iVar3 = getMuxNumPorts(this,muxIndexString_4.field_2._12_4_ + -1), (int)uVar1 <= iVar3;
        partialCode_2.field_2._12_4_ = partialCode_2.field_2._12_4_ + 1) {
      std::__cxx11::string::string((string *)(indexString_3.field_2._M_local_buf + 8));
      boost::lexical_cast<std::__cxx11::string,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e58,
                 (boost *)(partialCode_2.field_2._M_local_buf + 0xc),arg_10);
      std::operator+(&local_ed8,"    for(int i = 0; i < reading",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e58)
      ;
      std::operator+(&local_eb8,&local_ed8,"Mux");
      std::operator+(&local_e98,&local_eb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e10)
      ;
      std::operator+(&local_e78,&local_e98,"->size(); i++) {\n");
      std::__cxx11::string::operator=
                ((string *)(indexString_3.field_2._M_local_buf + 8),(string *)&local_e78);
      std::__cxx11::string::~string((string *)&local_e78);
      std::__cxx11::string::~string((string *)&local_e98);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::__cxx11::string::~string((string *)&local_ed8);
      std::operator+(&local_f98,"      mux",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e10)
      ;
      std::operator+(&local_f78,&local_f98,".add(reading");
      std::operator+(&local_f58,&local_f78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e58)
      ;
      std::operator+(&local_f38,&local_f58,"Mux");
      std::operator+(&local_f18,&local_f38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e10)
      ;
      std::operator+(&local_ef8,&local_f18,"->get(i));\n");
      std::__cxx11::string::operator+=
                ((string *)(indexString_3.field_2._M_local_buf + 8),(string *)&local_ef8);
      std::__cxx11::string::~string((string *)&local_ef8);
      std::__cxx11::string::~string((string *)&local_f18);
      std::__cxx11::string::~string((string *)&local_f38);
      std::__cxx11::string::~string((string *)&local_f58);
      std::__cxx11::string::~string((string *)&local_f78);
      std::__cxx11::string::~string((string *)&local_f98);
      std::__cxx11::string::operator+=((string *)(indexString_3.field_2._M_local_buf + 8),"    }\n")
      ;
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)(indexString_3.field_2._M_local_buf + 8)
                );
      std::__cxx11::string::~string((string *)local_e58);
      std::__cxx11::string::~string((string *)(indexString_3.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    std::__cxx11::string::~string((string *)local_e10);
    piVar4 = extraout_RDX_09;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PortMuxGenerator::generateCode() {
  std::string code;

  for(int j = 1; j <= numMuxes_; j++) {
    std::string muxIndexString = boost::lexical_cast<std::string>(j);
    for(int i = 1; i <= getMuxNumPorts(j - 1); i++) {
      std::string partialCode;
      std::string indexString = boost::lexical_cast<std::string>(i);
      partialCode = "  BufferedPort<Bottle> receiverBuff" + indexString + "Mux" + muxIndexString + ";\n";
      if (getFromRos()){
        partialCode += "  receiverBuff" + indexString + "Mux" + muxIndexString + ".setReadOnly();\n";
        code += partialCode;
        partialCode = "  bool receiver" + indexString + "Mux" + muxIndexString + "Ok = receiverBuff" + indexString + "Mux" + muxIndexString + ".open(\""+extractPortFromString(j-1, i)+"@/mux" + muxIndexString + "/receiver" + indexString +"\");\n";
      }
      else {
          code += partialCode;
          partialCode = "  bool receiver" + indexString + "Mux" + muxIndexString + "Ok = receiverBuff" + indexString + "Mux" + muxIndexString + ".open(\"/"+output_port_name+"/mux" + muxIndexString + "/receiver" + indexString +"\");\n";
      }
      code += partialCode;
    }
    code += "\n";
  }

  code += "  Port outputPort;\n";
  if (toRos_) {
    code += "  outputPort.promiseType(Type::byNameOnWire(\"" + getRosMessageName() + "\"));\n";
  }
  code += "  outputPort.setWriteOnly();\n";
  if(toRos_)
    code += "  bool outputOk = outputPort.open(\"" + getOutputName() + "@/yarp/"+output_port_name+"\");\n\n";
  else
    code += "  bool outputOk = outputPort.open(\"/writeBuff \");\n\n";

  if (!fromRos_){
    code += "  bool allConnected = false;\n";
    code += "  std::vector<std::vector<bool> > portsConnected;\n";
    code += "  portsConnected.resize(" + boost::lexical_cast<std::string>(numMuxes_) + ");\n";
    code += "  int totalConnections=0;\n";
    for(int j = 0; j < numMuxes_; j++) {
        code += "    portsConnected[" + boost::lexical_cast<std::string>(j) + "].resize(" + boost::lexical_cast<std::string>(getMuxNumPorts(j)) + ");\n";
        code += "    portsConnected[" + boost::lexical_cast<std::string>(j) + "].assign(" + boost::lexical_cast<std::string>(getMuxNumPorts(j)) + ",false);\n";
        code += "    totalConnections += " + boost::lexical_cast<std::string>(getMuxNumPorts(j)) + ";\n";
    }

    code += "\n";
    code += "  while (!allConnected){\n";
    code += "    int connectedNumber=totalConnections;\n";
    for(int j = 1; j <= numMuxes_; j++) {
        std::string muxIndexString = boost::lexical_cast<std::string>(j);
        for(int i = 1; i <= getMuxNumPorts(j-1); i++) {
            std::string indexString = boost::lexical_cast<std::string>(i);
            code += "    if (!portsConnected[" + boost::lexical_cast<std::string>(j-1) +"][" + indexString + "]){\n";
            code += "      portsConnected[" + boost::lexical_cast<std::string>(j-1) +"][" + indexString + "] = yarp.connect(\"" + extractPortFromString(j-1, i) + "\", receiverBuff" + indexString + "Mux" + muxIndexString + ".getName());\n";
            code += "      if (!portsConnected[" + boost::lexical_cast<std::string>(j-1) +"][" + indexString + "])\n";
            code += "        connectedNumber--;\n";
            code += "    }";
        }
    }
    code += "    if (connectedNumber == totalConnections)\n";
    code += "      allConnected = true;\n";
    code += "    std::cout << \".\\n\";\n";
    code += "    Time::delay(1);\n";
    code += "  }";
  }

  if(getFromRos()) {
    code += "  std::cout << \"Waiting for output...\" << std::endl;\n";
    code += "  bool connectSuccess = false;\n";
    code += "  while(!connectSuccess) {\n";
    code += "    connectSuccess = yarp.connect(\" /writeBuff\", \"" + getOutputName() + "\");\n";
    code += "    Time::delay(1);\n";
    code += "    std::cout << \".\\n\";\n";
    code += "  }\n";
    code += "  std::cout << \"Connection successfuly established.\" << std::endl;\n\n";
  }

  code += "  int counter = 0;\n\n";

  code += "  while(true){\n";
  for(int j = 1; j <= numMuxes_; j++) {
    std::string muxIndexString = boost::lexical_cast<std::string>(j);
    for(int i = 1; i <= getMuxNumPorts(j - 1); i++) {
      std::string partialCode;
      std::string indexString = boost::lexical_cast<std::string>(i);
      partialCode = "    Bottle* reading" + indexString + "Mux" + muxIndexString + " = receiverBuff" + indexString + "Mux" + muxIndexString + ".read();\n";
      code += partialCode;
    }
    code += "\n";
  }

  for(int j = 1; j <= numMuxes_; j++) {
    std::string muxIndexString = boost::lexical_cast<std::string>(j);
    code += "    Bottle mux" + muxIndexString + ";\n";
  }
  code += "\n";

  for(int j = 1; j <= numMuxes_; j++) {
    std::string muxIndexString = boost::lexical_cast<std::string>(j);
    for(int i = 1; i <= getMuxNumPorts(j - 1); i++) {
      std::string partialCode;
      std::string indexString = boost::lexical_cast<std::string>(i);
      partialCode = "    for(int i = 0; i < reading" + indexString + "Mux" + muxIndexString + "->size(); i++) {\n";
      partialCode += "      mux" + muxIndexString + ".add(reading" + indexString + "Mux" + muxIndexString + "->get(i));\n";
      partialCode += "    }\n";
      code += partialCode;
    }
    code += "\n";
  }

  return code;
}